

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

boolean emergency_disrobe(boolean *lostsome)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  obj *obj;
  ulong uVar4;
  obj *obj_00;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar1 = inv_cnt();
  iVar2 = near_capacity();
  if ((int)(uint)(uball == (obj *)0x0) < iVar2) {
    do {
      if (((int)uVar1 < 1) || (uVar3 = mt_random(), invent == (obj *)0x0)) {
        return '\0';
      }
      uVar4 = (ulong)uVar3 % (ulong)uVar1;
      obj_00 = (obj *)0x0;
      obj = invent;
      do {
        if (((obj->otyp != 0x210) || ((obj->field_0x4a & 1) == 0)) && (obj != uamul)) {
          iVar2 = (int)obj;
          iVar5 = (int)((ulong)obj >> 0x20);
          auVar11._0_4_ = -(uint)((int)uarmf == iVar2);
          auVar11._4_4_ = -(uint)((int)((ulong)uarmf >> 0x20) == iVar5);
          auVar11._8_4_ = -(uint)((int)uarmu == iVar2);
          auVar11._12_4_ = -(uint)((int)((ulong)uarmu >> 0x20) == iVar5);
          auVar13._4_4_ = auVar11._0_4_;
          auVar13._0_4_ = auVar11._4_4_;
          auVar13._8_4_ = auVar11._12_4_;
          auVar13._12_4_ = auVar11._8_4_;
          auVar10._0_4_ = -(uint)((int)uarmc == iVar2);
          auVar10._4_4_ = -(uint)((int)((ulong)uarmc >> 0x20) == iVar5);
          auVar10._8_4_ = -(uint)((int)uarmg == iVar2);
          auVar10._12_4_ = -(uint)((int)((ulong)uarmg >> 0x20) == iVar5);
          auVar12._4_4_ = auVar10._0_4_;
          auVar12._0_4_ = auVar10._4_4_;
          auVar12._8_4_ = auVar10._12_4_;
          auVar12._12_4_ = auVar10._8_4_;
          auVar13 = packssdw(auVar12 & auVar10,auVar13 & auVar11);
          auVar9._0_4_ = -(uint)((int)ublindf == iVar2);
          auVar9._4_4_ = -(uint)((int)((ulong)ublindf >> 0x20) == iVar5);
          auVar9._8_4_ = -(uint)((int)uarm == iVar2);
          auVar9._12_4_ = -(uint)((int)((ulong)uarm >> 0x20) == iVar5);
          auVar8._4_4_ = auVar9._0_4_;
          auVar8._0_4_ = auVar9._4_4_;
          auVar8._8_4_ = auVar9._12_4_;
          auVar8._12_4_ = auVar9._8_4_;
          auVar7._0_4_ = -(uint)((int)uleft == iVar2);
          auVar7._4_4_ = -(uint)((int)((ulong)uleft >> 0x20) == iVar5);
          auVar7._8_4_ = -(uint)((int)uright == iVar2);
          auVar7._12_4_ = -(uint)((int)((ulong)uright >> 0x20) == iVar5);
          auVar6._4_4_ = auVar7._0_4_;
          auVar6._0_4_ = auVar7._4_4_;
          auVar6._8_4_ = auVar7._12_4_;
          auVar6._12_4_ = auVar7._8_4_;
          auVar7 = packssdw(auVar6 & auVar7,auVar8 & auVar9);
          auVar7 = packssdw(auVar7,auVar13);
          if (((((((((auVar7 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                    (auVar7 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar7 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar7 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar7 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar7 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar7 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < auVar7[0xf]) &&
             ((((obj->field_0x4a & 1) == 0 || ((obj != uarmh && (obj != uarms)))) &&
              (iVar2 = welded(obj), iVar2 == 0)))) {
            obj_00 = obj;
          }
        }
        if (((int)uVar4 < 1) && (obj_00 != (obj *)0x0)) goto LAB_0026c753;
        uVar4 = (ulong)((int)uVar4 - 1);
        obj = obj->nobj;
      } while (obj != (obj *)0x0);
      if (obj_00 == (obj *)0x0) {
        return '\0';
      }
LAB_0026c753:
      if (obj_00->owornmask != 0) {
        remove_worn_item(obj_00,'\0');
      }
      *lostsome = '\x01';
      dropx(obj_00);
      uVar1 = uVar1 - 1;
      iVar2 = near_capacity();
    } while ((int)(uint)(uball == (obj *)0x0) < iVar2);
  }
  return '\x01';
}

Assistant:

static boolean emergency_disrobe(boolean *lostsome)
{
	int invc = inv_cnt();

	while (near_capacity() > (Punished ? UNENCUMBERED : SLT_ENCUMBER)) {
	    struct obj *obj, *otmp = NULL;
	    int i;

	    /* Pick a random object */
	    if (invc > 0) {
		i = rn2(invc);
		for (obj = invent; obj; obj = obj->nobj) {
		    /*
		     * Undroppables are: body armor, boots, gloves,
		     * amulets, and rings because of the time and effort
		     * in removing them + loadstone and other cursed stuff
		     * for obvious reasons.
		     */
		    if (!((obj->otyp == LOADSTONE && obj->cursed) ||
			  obj == uamul || obj == uleft || obj == uright ||
			  obj == ublindf || obj == uarm || obj == uarmc ||
			  obj == uarmg || obj == uarmf || obj == uarmu ||
			  (obj->cursed && (obj == uarmh || obj == uarms)) ||
			  welded(obj)))
			otmp = obj;
		    /* reached the mark and found some stuff to drop? */
		    if (--i < 0 && otmp) break;

		    /* else continue */
		}
	    }
	    if (!otmp)
		return FALSE; /* nothing to drop! */

	    if (otmp->owornmask) remove_worn_item(otmp, FALSE);
	    *lostsome = TRUE;
	    dropx(otmp);
	    invc--;
	}
	return TRUE;
}